

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O2

void __thiscall
Memory::LargeHeapBlock::Check(LargeHeapBlock *this,bool expectFull,bool expectPending)

{
  _func_int **pp_Var1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  undefined7 in_register_00000011;
  undefined7 in_register_00000031;
  ulong uVar5;
  
  puVar4 = (undefined4 *)
           __tls_get_addr(&PTR_013e5f18,CONCAT71(in_register_00000031,expectFull),
                          CONCAT71(in_register_00000011,expectPending));
  uVar5 = 0;
  do {
    if (this->allocCount <= uVar5) {
      return;
    }
    pp_Var1 = (&this[1].super_HeapBlock._vptr_HeapBlock)[uVar5];
    if (pp_Var1 != (_func_int **)0x0) {
      if ((pp_Var1 != (_func_int **)((ulong)pp_Var1 & 0xfffffffffffffffe)) &&
         (this->hasPartialFreeObjects == false)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar4 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                           ,0x88d,"(this->hasPartialFreeObjects || header == this->HeaderList()[i])"
                           ,"this->hasPartialFreeObjects || header == this->HeaderList()[i]");
        if (!bVar3) goto LAB_0065ef9a;
        *puVar4 = 0;
      }
      if (uVar5 != *(uint *)((ulong)pp_Var1 & 0xfffffffffffffffe)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar4 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                           ,0x88f,"(header->objectIndex == i)","header->objectIndex == i");
        if (!bVar3) {
LAB_0065ef9a:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar4 = 0;
      }
    }
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

void
LargeHeapBlock::Check(bool expectFull, bool expectPending)
{
    for (uint i = 0; i < allocCount; i++)
    {
        LargeObjectHeader * header = this->HeaderList()[i];
        if (header == nullptr)
        {
            continue;
        }
#if ENABLE_PARTIAL_GC && ENABLE_CONCURRENT_GC
        header = (LargeObjectHeader *)((size_t)header & ~PartialFreeBit);
        Assert(this->hasPartialFreeObjects || header == this->HeaderList()[i]);
#endif
        Assert(header->objectIndex == i);
    }
}